

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_duplicate(Integer g_a,Integer *g_b,char *array_name)

{
  long lVar1;
  int iVar2;
  char **ppcVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  C_Integer *pCVar10;
  Integer type;
  logical lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  Integer local_150;
  char err_string [256];
  
  iVar6 = _ga_sync_end;
  local_150 = GAme;
  bVar17 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar8 = GA[g_a + 1000].p_handle;
  lVar14 = (long)iVar8;
  if (bVar17) {
    pnga_pgroup_sync(lVar14);
  }
  if (0 < iVar8) {
    local_150 = (Integer)PGRP_LIST[lVar14].map_proc_list[GAme];
  }
  GAstat.numcre = GAstat.numcre + 1;
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_duplicate");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_duplicate");
    pnga_error(err_string,g_a);
  }
  piVar9 = &GA->actv_handle;
  uVar12 = 0xffffffffffffffff;
  do {
    iVar2 = *piVar9;
    uVar15 = uVar12 + 1;
    if (iVar2 == 0) break;
    lVar13 = uVar12 + 2;
    piVar9 = piVar9 + 0xda;
    uVar12 = uVar15;
  } while (lVar13 < _max_global_array);
  uVar15 = -(ulong)(iVar2 != 0) | uVar15;
  if (iVar2 != 0) {
    pnga_error("ga_duplicate: too many arrays",(long)_max_global_array);
  }
  *g_b = uVar15 - 1000;
  GA[uVar15].actv_handle = 1;
  gai_init_struct((int)uVar15);
  pgVar5 = GA + uVar15;
  ppcVar3 = GA[uVar15].ptr;
  memcpy(GA + uVar15,GA + lVar1,0x368);
  strcpy(pgVar5->name,array_name);
  GA[uVar15].ptr = ppcVar3;
  pgVar5 = GA;
  GA[uVar15].distr_type = GA[lVar1].distr_type;
  uVar7 = calc_maplen((int)lVar1);
  if (0 < (int)uVar7) {
    uVar16 = (ulong)uVar7;
    pCVar10 = (C_Integer *)malloc(uVar16 * 8 + 8);
    pgVar5[uVar15].mapc = pCVar10;
    pCVar10 = GA[lVar1].mapc;
    pCVar4 = GA[uVar15].mapc;
    uVar12 = 0;
    do {
      pCVar4[uVar12] = pCVar10[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    GA[uVar15].mapc[uVar16] = -1;
  }
  GA[uVar15].cache = (double *)0x0;
  pnga_set_ghost_info(*g_b);
  GA[uVar15].rstrctd_list = (C_Integer *)0x0;
  GA[uVar15].rank_rstrctd = (C_Integer *)0x0;
  pgVar5 = GA;
  GA[uVar15].num_rstrctd = 0;
  if (0 < pgVar5[lVar1].num_rstrctd) {
    pgVar5[uVar15].num_rstrctd = pgVar5[lVar1].num_rstrctd;
    pnga_set_restricted(*g_b,pgVar5[lVar1].rstrctd_list,pgVar5[lVar1].num_rstrctd);
  }
  lVar1 = GA[uVar15].size;
  GA[uVar15].id = -1;
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory - lVar1;
    err_string._0_8_ = (ulong)~GA_total_memory >> 0x3f;
    type = pnga_type_f2c(0x3f2);
    if (iVar8 < 1) {
      pnga_gop(type,err_string,1,"&&");
    }
    else {
      pnga_pgroup_gop(lVar14,type,err_string,1,"&&");
    }
  }
  else {
    err_string[0] = '\x01';
    err_string[1] = '\0';
    err_string[2] = '\0';
    err_string[3] = '\0';
    err_string[4] = '\0';
    err_string[5] = '\0';
    err_string[6] = '\0';
    err_string[7] = '\0';
  }
  if (err_string._0_8_ == 0) {
    GA[uVar15].ptr[local_150] = (char *)0x0;
  }
  else {
    uVar7 = GA[uVar15].mem_dev_set;
    if (uVar7 == 0) {
      iVar8 = gai_get_shmem(GA[uVar15].ptr,lVar1,GA[uVar15].type,&GA[uVar15].id,iVar8);
    }
    else {
      iVar8 = gai_get_devmem((char *)(ulong)uVar7,GA[uVar15].ptr,lVar1,GA[uVar15].type,
                             &GA[uVar15].id,iVar8,uVar7,GA[uVar15].mem_dev);
    }
    err_string._0_8_ = ZEXT18(iVar8 == 0);
  }
  if (iVar6 != 0) {
    pnga_pgroup_sync(lVar14);
  }
  if (err_string._0_8_ == 0) {
    if (GA_memory_limited == '\x01') {
      GA_total_memory = GA_total_memory + lVar1;
    }
    pnga_destroy(*g_b);
    lVar11 = 0;
  }
  else {
    GAstat.curmem = GAstat.curmem + GA[uVar15].size;
    lVar14 = GAstat.curmem;
    if (GAstat.curmem < GAstat.maxmem) {
      lVar14 = GAstat.maxmem;
    }
    lVar11 = 1;
    GAstat.maxmem = lVar14;
  }
  return lVar11;
}

Assistant:

logical pnga_duplicate(Integer g_a, Integer *g_b, char* array_name)
{
  char     **save_ptr;
  C_Long  mem_size, mem_size_proc;
  Integer  i, ga_handle, status;
  int local_sync_begin,local_sync_end;
  Integer grp_id, grp_me=GAme;
  /* Integer grp_nproc=GAnproc; */
  int maplen;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  if (grp_id > 0) {
    /* grp_nproc  = PGRP_LIST[grp_id].map_nproc; */
    grp_me = PGRP_LIST[grp_id].map_proc_list[GAme];
  }

  GAstat.numcre ++; 

  ga_check_handleM(g_a,"ga_duplicate");       

  /* find a free global_array handle for g_b */
  ga_handle =-1; i=0;
  do{
    if(!GA[i].actv_handle) ga_handle=i;
    i++;
  }while(i<_max_global_array && ga_handle==-1);
  if( ga_handle == -1)
    pnga_error("ga_duplicate: too many arrays", (Integer)_max_global_array);
  *g_b = (Integer)ga_handle - GA_OFFSET;
   GA[ga_handle].actv_handle = 1;

  gai_init_struct(ga_handle);

  /*** copy content of the data structure ***/
  save_ptr = GA[ga_handle].ptr;
  GA[ga_handle] = GA[GA_OFFSET + g_a]; /* <--- shallow copy */
  strcpy(GA[ga_handle].name, array_name);
  GA[ga_handle].ptr = save_ptr;
  GA[ga_handle].distr_type = GA[GA_OFFSET + g_a].distr_type;
  maplen = calc_maplen(GA_OFFSET + g_a);
  if (maplen > 0) {
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
    GA[ga_handle].mapc[maplen] = -1;
  }

  /*** if ghost cells are used, initialize ghost cache data ***/
  GA[ga_handle].cache = NULL;
  pnga_set_ghost_info(*g_b);

  /*** initialize and copy info for restricted arrays, if relevant ***/
  GA[ga_handle].rstrctd_list = NULL;
  GA[ga_handle].rank_rstrctd = NULL;
  GA[ga_handle].num_rstrctd = 0;
  if (GA[GA_OFFSET + g_a].num_rstrctd > 0) {
    GA[ga_handle].num_rstrctd = GA[GA_OFFSET + g_a].num_rstrctd;
    pnga_set_restricted(*g_b, GA[GA_OFFSET + g_a].rstrctd_list,
        GA[GA_OFFSET + g_a].num_rstrctd);
  }

  /*** Memory Allocation & Initialization of GA Addressing Space ***/
  mem_size = mem_size_proc = GA[ga_handle].size; 
  GA[ga_handle].id = INVALID_MA_HANDLE;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size_proc;

  /* check if everybody has enough memory left */
  if(GA_memory_limited){
    status = (GA_total_memory >= 0) ? 1 : 0;
    if (grp_id > 0) {
      /* pnga_pgroup_gop(grp_id, pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
      pnga_pgroup_gop(grp_id, pnga_type_f2c(MT_F_INT), &status, 1, "&&");
      status = (Integer)status;
    } else {
      /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
      pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    }
  }else status = 1;

  if(status)
  {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(array_name, GA[ga_handle].ptr,mem_size,
          (int)GA[ga_handle].type, &GA[ga_handle].id,
          (int)grp_id,GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(array_name, GA[ga_handle].ptr,mem_size,
          (int)GA[ga_handle].type, &GA[ga_handle].id,
          (int)grp_id);
    }
}
  else{
    GA[ga_handle].ptr[grp_me]=NULL;
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

#     ifdef GA_CREATE_INDEF
  /* This code is incorrect. It needs to fixed if INDEF is ever used */
  if(status){
    Integer one = 1; 
    Integer dim1 =(Integer)GA[ga_handle].dims[1], dim2=(Integer)GA[ga_handle].dims[2];
    if(GAme==0)fprintf(stderr,"duplicate:initializing GA array%ld\n",g_b);
    if(GA[ga_handle].type == C_DBL) {
      double bad = (double) DBL_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_INT) {
      int bad = (int) INT_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_LONG) {
      long bad = LONG_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_LONGLONG) {
      long long bad = LONG_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_DCPL) { 
      DoubleComplex bad = {DBL_MAX, DBL_MAX};
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_SCPL) { 
      SingleComplex bad = {FLT_MAX, FLT_MAX};
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);
    } else if (GA[ga_handle].type == C_FLOAT) {
      float bad = FLT_MAX;
      ga_fill_patch_(g_b, &one, &dim1, &one, &dim2,  &bad);   
    } else {
      pnga_error("ga_duplicate: type not supported ",GA[ga_handle].type);
    }
  }
#     endif

  if(status){
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    return(TRUE);
  }else{ 
    if (GA_memory_limited) GA_total_memory += mem_size_proc;
    pnga_destroy(*g_b);
    return(FALSE);
  }
}